

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O2

void convert_sinsn(iasctx *ctx,easm_sinsn *sinsn)

{
  int iVar1;
  litem *plVar2;
  litem **pplVar3;
  int iVar4;
  long lVar5;
  
  plVar2 = (litem *)calloc(0x20,1);
  plVar2->str = sinsn->str;
  iVar4 = ctx->atomsnum;
  iVar1 = ctx->atomsmax;
  if (iVar4 < iVar1) {
    pplVar3 = ctx->atoms;
  }
  else {
    iVar4 = 0x10;
    if (iVar1 != 0) {
      iVar4 = iVar1 * 2;
    }
    ctx->atomsmax = iVar4;
    pplVar3 = (litem **)realloc(ctx->atoms,(long)iVar4 << 3);
    ctx->atoms = pplVar3;
    iVar4 = ctx->atomsnum;
  }
  ctx->atomsnum = iVar4 + 1;
  pplVar3[iVar4] = plVar2;
  for (lVar5 = 0; lVar5 < sinsn->operandsnum; lVar5 = lVar5 + 1) {
    convert_operand(ctx,sinsn->operands[lVar5]);
  }
  convert_mods(ctx,sinsn->mods);
  return;
}

Assistant:

void convert_sinsn(struct iasctx *ctx, struct easm_sinsn *sinsn) {
	int i;
	struct litem *li = calloc(sizeof *li, 1);
	li->type = LITEM_NAME;
	li->str = sinsn->str;
	ADDARRAY(ctx->atoms, li);
	for (i = 0; i < sinsn->operandsnum; i++) {
		convert_operand(ctx, sinsn->operands[i]);
	}
	convert_mods(ctx, sinsn->mods);
}